

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash.c
# Opt level: O2

void nni_id_map_init(nni_id_map *m,uint64_t lo,uint64_t hi,_Bool randomize)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = lo + (lo == 0);
  uVar1 = 0xffffffff;
  if (hi != 0) {
    uVar1 = hi;
  }
  if (uVar1 <= uVar2) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/idhash.c",
              0x24,"hi > lo");
  }
  m->id_max_load = 0;
  m->id_cap = 0;
  m->id_count = 0;
  m->id_load = 0;
  m->id_min_load = 0;
  m->id_dyn_val = 0;
  m->id_entries = (nni_id_entry *)0x0;
  m->id_min_val = uVar2;
  m->id_max_val = uVar1;
  m->id_flags = (uint)randomize * 2;
  return;
}

Assistant:

void
nni_id_map_init(nni_id_map *m, uint64_t lo, uint64_t hi, bool randomize)
{
	if (lo == 0) {
		lo = 1;
	}
	if (hi == 0) {
		hi = 0xffffffffu;
	}
	NNI_ASSERT(lo != 0);
	NNI_ASSERT(hi > lo);
	m->id_entries  = NULL;
	m->id_count    = 0;
	m->id_load     = 0;
	m->id_cap      = 0;
	m->id_dyn_val  = 0;
	m->id_max_load = 0;
	m->id_min_load = 0; // never shrink below this
	m->id_min_val  = lo;
	m->id_max_val  = hi;
	if (randomize) {
		m->id_flags = NNI_ID_FLAG_RANDOM;
	} else {
		m->id_flags = 0;
	}
}